

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

exr_result_t exr_attr_set_float(exr_context_t ctxt,int part_index,char *name,float val)

{
  int iVar1;
  exr_result_t eVar2;
  code *UNRECOVERED_JUMPTABLE;
  exr_attribute_list_t *list;
  undefined8 uStackY_50;
  exr_attribute_t *attr;
  
  if (name != (char *)0x0) {
    iVar1 = strcmp(name,"pixelAspectRatio");
    if (iVar1 == 0) {
      eVar2 = exr_set_pixel_aspect_ratio(ctxt,part_index,val);
      return eVar2;
    }
    iVar1 = strcmp(name,"screenWindowWidth");
    if (iVar1 == 0) {
      eVar2 = exr_set_screen_window_width(ctxt,part_index,val);
      return eVar2;
    }
  }
  attr = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((-1 < part_index) && (part_index < *(int *)(ctxt + 0xc4))) {
    if (*ctxt == (_priv_exr_context_t)0x3) {
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
      uStackY_50 = 0x15;
    }
    else {
      if (*ctxt != (_priv_exr_context_t)0x0) {
        list = (exr_attribute_list_t *)
               (*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8);
        eVar2 = exr_attr_list_find_by_name(ctxt,list,name,&attr);
        if (eVar2 == 0) {
          if (attr->type != EXR_ATTR_FLOAT) {
            eVar2 = (**(code **)(ctxt + 0x48))
                              (ctxt,0x10,
                               "\'%s\' requested type \'f\', but stored attributes is type \'%s\'",
                               name,attr->type_name);
            return eVar2;
          }
        }
        else {
          if (eVar2 != 0xf) {
            return eVar2;
          }
          if (*ctxt != (_priv_exr_context_t)0x1) {
            return 0xf;
          }
          eVar2 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_FLOAT,0,(uint8_t **)0x0,&attr);
          if (eVar2 != 0) {
            return eVar2;
          }
        }
        (attr->field_6).f = val;
        return 0;
      }
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
      uStackY_50 = 8;
    }
    eVar2 = (*UNRECOVERED_JUMPTABLE)(ctxt,uStackY_50);
    return eVar2;
  }
  eVar2 = (**(code **)(ctxt + 0x48))
                    (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_set_float (
    exr_context_t ctxt, int part_index, const char* name, float val)
{
    if (name && 0 == strcmp (name, EXR_REQ_PAR_STR))
        return exr_set_pixel_aspect_ratio (ctxt, part_index, val);
    if (name && 0 == strcmp (name, EXR_REQ_SCR_WW_STR))
        return exr_set_screen_window_width (ctxt, part_index, val);

    ATTR_SET_IMPL (EXR_ATTR_FLOAT, f);
}